

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall
re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,SparseSet *matches)

{
  undefined1 uVar1;
  bool bVar2;
  DFA *this_00;
  size_type sVar3;
  const_pointer pcVar4;
  byte bVar5;
  const_pointer pcVar6;
  byte bVar7;
  bool bVar8;
  StringPiece context;
  char *ep;
  StringPiece *local_38;
  
  *failed = false;
  context.data_ = const_context->data_;
  context.size_ = const_context->size_;
  if (context.data_ == (const_pointer)0x0) {
    context.data_ = text->data_;
    context.size_ = text->size_;
  }
  uVar1 = this->anchor_start_;
  bVar8 = this->anchor_end_;
  bVar7 = uVar1;
  bVar5 = bVar8;
  if (this->reversed_ != false) {
    bVar7 = bVar8;
    bVar5 = uVar1;
  }
  if (((bVar7 == 1) && (context.data_ != text->data_)) ||
     ((bVar5 != 0 && (context.data_ + context.size_ != text->data_ + text->size_)))) {
    return false;
  }
  bVar5 = true;
  if (anchor != kAnchored) {
    bVar5 = kind == kFullMatch | uVar1;
  }
  if (kind == kFullMatch) {
LAB_001cafb7:
    kind = kLongestMatch;
    bVar7 = 1;
  }
  else {
    if (kind == kManyMatch) {
      bVar8 = matches == (SparseSet *)0x0;
      bVar7 = 0;
      kind = kManyMatch;
      goto LAB_001cafe6;
    }
    if (bVar8 != false) goto LAB_001cafb7;
    bVar7 = 0;
  }
  if (match0 == (StringPiece *)0x0) {
    bVar8 = (bool)(bVar7 ^ 1);
    if (bVar7 == 0) {
      kind = kLongestMatch;
    }
  }
  else {
    bVar8 = false;
  }
LAB_001cafe6:
  local_38 = match0;
  this_00 = GetDFA(this,kind);
  bVar2 = DFA::Search(this_00,text,&context,(bool)bVar5,bVar8,(bool)(this->reversed_ ^ 1),failed,&ep
                      ,matches);
  bVar8 = false;
  if ((bVar2) && (bVar8 = false, *failed == false)) {
    if (bVar7 != 0) {
      if (this->reversed_ == false) {
        sVar3 = text->size_;
      }
      else {
        sVar3 = 0;
      }
      if (ep != text->data_ + sVar3) {
        return false;
      }
    }
    bVar8 = true;
    if (local_38 != (StringPiece *)0x0) {
      pcVar4 = text->data_;
      pcVar6 = pcVar4 + text->size_;
      if (this->reversed_ != false) {
        pcVar4 = ep;
        ep = pcVar6;
      }
      local_38->data_ = pcVar4;
      local_38->size_ = (long)ep - (long)pcVar4;
    }
  }
  return bVar8;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind, StringPiece* match0,
                     bool* failed, SparseSet* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  bool carat = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    using std::swap;
    swap(carat, dollar);
  }
  if (carat && context.begin() != text.begin())
    return false;
  if (dollar && context.end() != text.end())
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "earliest match".
  bool want_earliest_match = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
    if (matches == NULL) {
      want_earliest_match = true;
    }
  } else if (match0 == NULL && !endmatch) {
    want_earliest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_earliest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed)
    return false;
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.data() : text.data() + text.size()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      *match0 =
          StringPiece(ep, static_cast<size_t>(text.data() + text.size() - ep));
    else
      *match0 =
          StringPiece(text.data(), static_cast<size_t>(ep - text.data()));
  }
  return true;
}